

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O3

void kj::_::Debug::log<char_const(&)[62],kj::Path&>
               (char *file,int line,LogSeverity severity,char *macroArgs,char (*params) [62],
               Path *params_1)

{
  long lVar1;
  undefined8 uVar2;
  undefined4 in_register_00000014;
  long lVar3;
  String argValues [2];
  ArrayPtr<kj::String> in_stack_ffffffffffffff78;
  char *apcStack_78 [2];
  size_t sStack_68;
  ArrayDisposer *pAStack_60;
  String local_50;
  PathPtr local_38;
  
  str<char_const(&)[62]>
            ((String *)&stack0xffffffffffffff78,(kj *)params,
             (char (*) [62])CONCAT44(in_register_00000014,severity));
  local_38.parts.ptr = (params_1->parts).ptr;
  local_38.parts.size_ = (params_1->parts).size_;
  PathPtr::toString(&local_50,&local_38,false);
  apcStack_78[1] = local_50.content.ptr;
  sStack_68 = local_50.content.size_;
  pAStack_60 = local_50.content.disposer;
  logInternal((Debug *)file,(char *)(ulong)(uint)line,severity,(LogSeverity)macroArgs,
              &stack0xffffffffffffff78,in_stack_ffffffffffffff78);
  lVar3 = 0x18;
  do {
    lVar1 = *(long *)(&stack0xffffffffffffff78 + lVar3);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)(&stack0xffffffffffffff80 + lVar3);
      *(undefined8 *)(&stack0xffffffffffffff78 + lVar3) = 0;
      *(undefined8 *)(&stack0xffffffffffffff80 + lVar3) = 0;
      (**(code **)**(undefined8 **)((long)apcStack_78 + lVar3))
                (*(undefined8 **)((long)apcStack_78 + lVar3),lVar1,1,uVar2,uVar2,0);
    }
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  return;
}

Assistant:

void Debug::log(const char* file, int line, LogSeverity severity, const char* macroArgs,
                Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  logInternal(file, line, severity, macroArgs, arrayPtr(argValues, sizeof...(Params)));
}